

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi-threads-1.cpp
# Opt level: O0

void __thiscall consumer_t::consume(consumer_t *this)

{
  redis_accessor_t *prVar1;
  type *in_R8;
  undefined1 local_30 [32];
  consumer_t *local_10;
  consumer_t *this_local;
  
  prVar1 = this->redis;
  local_30._0_8_ = this;
  local_10 = this;
  boost::asio::
  bind_executor<boost::asio::io_context::strand,consumer_t::consume()::_lambda(boost::system::error_code_const&,bredis::positive_parse_result_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>,bredis::parsing_policy::keep_result>&&)_1_>
            ((executor_binder<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_multi_threads_1_cpp:90:47),_boost::asio::io_context::strand>
              *)(local_30 + 8),(asio *)&prVar1->strand,(strand *)local_30,
             (anon_class_8_1_8991fb9c_for_target_ *)0x0,in_R8);
  bredis::
  Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::
  async_read<boost::asio::basic_streambuf<std::allocator<char>>,boost::asio::executor_binder<consumer_t::consume()::_lambda(boost::system::error_code_const&,bredis::positive_parse_result_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>,bredis::parsing_policy::keep_result>&&)_1_,boost::asio::io_context::strand>,bredis::parsing_policy::keep_result>
            ((Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)&prVar1->conn,&prVar1->rx_buff,
             (executor_binder<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_multi_threads_1_cpp:90:47),_boost::asio::io_context::strand>
              *)(local_30 + 8),1);
  boost::asio::
  executor_binder<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/basiliscos[P]cpp-bredis/examples/multi-threads-1.cpp:90:47),_boost::asio::io_context::strand>
  ::~executor_binder((executor_binder<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_multi_threads_1_cpp:90:47),_boost::asio::io_context::strand>
                      *)(local_30 + 8));
  return;
}

Assistant:

void consume(){
        redis.conn.async_read(
            redis.rx_buff,
            asio::bind_executor(redis.strand, [this](const sys::error_code &ec, result_t &&r){
                if(!ec){
                    auto self = this;
                    self->redis.pong_count++;
                    self->redis.rx_buff.consume(r.consumed);
                    self->consume();
                }
            })
        );
    }